

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O1

void __thiscall
ScriptMemoryDumper::DumpLargeBucket(ScriptMemoryDumper *this,LargeHeapBucket *heapBucket)

{
  LargeHeapBlock *heapBlock_5;
  LargeHeapBlock *pLVar1;
  LargeHeapBlock *heapBlock;
  
  for (pLVar1 = heapBucket->fullLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    DumpLargeHeapBlock(this,pLVar1);
  }
  for (pLVar1 = heapBucket->largeBlockList; pLVar1 != (LargeHeapBlock *)0x0; pLVar1 = pLVar1->next)
  {
    DumpLargeHeapBlock(this,pLVar1);
  }
  for (pLVar1 = heapBucket->largePageHeapBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    DumpLargeHeapBlock(this,pLVar1);
  }
  for (pLVar1 = heapBucket->pendingDisposeLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    DumpLargeHeapBlock(this,pLVar1);
  }
  for (pLVar1 = heapBucket->pendingSweepLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    DumpLargeHeapBlock(this,pLVar1);
  }
  for (pLVar1 = heapBucket->partialSweptLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    DumpLargeHeapBlock(this,pLVar1);
  }
  return;
}

Assistant:

void ScriptMemoryDumper::DumpLargeBucket(LargeHeapBucket* heapBucket)
{
    DumpLargeHeapBlockList(heapBucket->fullLargeBlockList);
    DumpLargeHeapBlockList(heapBucket->largeBlockList);
#ifdef RECYCLER_PAGE_HEAP
    DumpLargeHeapBlockList(heapBucket->largePageHeapBlockList);
#endif
    DumpLargeHeapBlockList(heapBucket->pendingDisposeLargeBlockList);
#if ENABLE_CONCURRENT_GC
    DumpLargeHeapBlockList(heapBucket->pendingSweepLargeBlockList);
#if ENABLE_PARTIAL_GC
    DumpLargeHeapBlockList(heapBucket->partialSweptLargeBlockList);
#endif
#endif
}